

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNonDsd.c
# Opt level: O2

int Dau_DecCheckSetTop5(word *p,int nVars,int nVarsF,int nVarsB,int nVarsS,int uMaskS,int *pSched,
                       word *pDec,word *pComp)

{
  uint uVar1;
  byte bVar2;
  byte bVar3;
  word wVar4;
  byte bVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  char *__assertion;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  word wVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  int pVarsB [16];
  int pVarsS [16];
  word Cof [2] [64];
  
  bVar3 = (byte)nVarsF;
  bVar2 = (byte)nVarsB & 0x1f;
  uVar13 = 1 << ((byte)nVarsS & 0x1f);
  if (nVarsB + nVarsF == nVars) {
    if (nVars < 0x11) {
      if (nVarsS < 7) {
        if (nVarsF - 1U < 5) {
          bVar5 = 6 - bVar3;
          uVar6 = 0;
          uVar11 = 0;
          if (0 < nVarsB) {
            uVar11 = (ulong)(uint)nVarsB;
          }
          iVar14 = 0;
          iVar17 = 0;
          for (; uVar11 != uVar6; uVar6 = uVar6 + 1) {
            iVar7 = -1;
            if (((uint)uMaskS >> ((uint)uVar6 & 0x1f) & 1) == 0) {
              iVar9 = iVar17;
              iVar17 = iVar17 + 1;
            }
            else {
              iVar9 = iVar7;
              iVar7 = iVar14;
              iVar14 = iVar14 + 1;
            }
            pVarsS[uVar6] = iVar7;
            pVarsB[uVar6] = iVar9;
          }
          if (iVar14 == nVarsS) {
            if (iVar17 == nVarsB - nVarsS) {
              uVar6 = 0;
              uVar11 = 0;
              if (0 < (int)uVar13) {
                uVar11 = (ulong)uVar13;
              }
              for (; uVar11 != uVar6; uVar6 = uVar6 + 1) {
                Cof[1][uVar6] = 0xffffffffffffffff;
                Cof[0][uVar6] = 0xffffffffffffffff;
              }
              uVar12 = 0;
              uVar6 = (ulong)(uint)(1 << bVar2);
              if (1 << bVar2 < 1) {
                uVar6 = uVar12;
              }
              uVar8 = 0;
              uVar18 = 0;
              uVar16 = 0;
              do {
                if (uVar6 == uVar12) {
                  if (pComp != (word *)0x0) {
                    for (uVar6 = 0; uVar11 != uVar6; uVar6 = uVar6 + 1) {
                      uVar8 = (uint)uVar6;
                      wVar4 = Cof[0][uVar6];
                      pComp[uVar8 >> (bVar5 & 0x1f)] =
                           pComp[uVar8 >> (bVar5 & 0x1f)] |
                           wVar4 << ((byte)(uVar8 << (bVar3 & 0x1f)) & 0x3f);
                      wVar15 = Cof[1][uVar6];
                      if (Cof[1][uVar6] == 0xffffffffffffffff) {
                        wVar15 = wVar4;
                      }
                      pComp[(int)(uVar13 + uVar8) >> (bVar5 & 0x1f)] =
                           pComp[(int)(uVar13 + uVar8) >> (bVar5 & 0x1f)] |
                           wVar15 << ((byte)(uVar13 + uVar8 << (bVar3 & 0x1f)) & 0x3f);
                    }
                    if (nVarsS + nVarsF < 5) {
                      wVar4 = Abc_Tt6Stretch(*pComp,nVarsS + nVarsF + 1);
                      *pComp = wVar4;
                    }
                  }
                  if (nVarsB < 6 && pDec != (word *)0x0) {
                    wVar4 = Abc_Tt6Stretch(*pDec,nVarsB);
                    *pDec = wVar4;
                  }
                  return 1;
                }
                uVar10 = p[(int)uVar8 >> (bVar5 & 0x1f)] >> ((byte)(uVar8 << (bVar3 & 0x1f)) & 0x3f)
                         & ~(-1L << ((byte)(1 << (bVar3 & 0x1f)) & 0x3f));
                if ((Cof[0][(int)uVar16] == 0xffffffffffffffff) || (Cof[0][(int)uVar16] == uVar10))
                {
                  Cof[0][(int)uVar16] = uVar10;
                }
                else {
                  if ((Cof[1][(int)uVar16] != 0xffffffffffffffff) && (Cof[1][(int)uVar16] != uVar10)
                     ) {
                    return 0;
                  }
                  Cof[1][(int)uVar16] = uVar10;
                  if (pDec != (word *)0x0) {
                    iVar14 = (uVar16 << ((byte)(nVarsB - nVarsS) & 0x1f)) + uVar18;
                    pDec[iVar14 >> 6] = pDec[iVar14 >> 6] | 1L << ((byte)iVar14 & 0x3f);
                  }
                }
                uVar1 = pSched[uVar12];
                if (((uint)uMaskS >> (uVar1 & 0x1f) & 1) == 0) {
                  uVar18 = uVar18 ^ 1 << (*(byte *)(pVarsB + (int)uVar1) & 0x1f);
                }
                else {
                  uVar16 = uVar16 ^ 1 << (*(byte *)(pVarsS + (int)uVar1) & 0x1f);
                }
                uVar8 = uVar8 ^ 1 << (uVar1 & 0x1f);
                uVar12 = uVar12 + 1;
              } while( true );
            }
            __assertion = "b == nVarsB-nVarsS";
            uVar13 = 0x43;
          }
          else {
            __assertion = "s == nVarsS";
            uVar13 = 0x42;
          }
        }
        else {
          __assertion = "nVarsF >= 1 && nVarsF <= 5";
          uVar13 = 0x3b;
        }
      }
      else {
        __assertion = "nVarsS <= 6";
        uVar13 = 0x3a;
      }
    }
    else {
      __assertion = "nVars <= 16";
      uVar13 = 0x39;
    }
  }
  else {
    __assertion = "nVars == nVarsB + nVarsF";
    uVar13 = 0x38;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNonDsd.c"
                ,uVar13,
                "int Dau_DecCheckSetTop5(word *, int, int, int, int, int, int *, word *, word *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////
 
/**Function*************************************************************

  Synopsis    [Checks decomposability with given variable set.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Dau_DecCheckSetTop5( word * p, int nVars, int nVarsF, int nVarsB, int nVarsS, int uMaskS, int * pSched, word * pDec, word * pComp )
{
    word Cof[2][64], Value;
    word MaskFF = (((word)1) << (1 << nVarsF)) - 1;
    int ShiftF = 6 - nVarsF, MaskF = (1 << ShiftF) - 1;
    int pVarsS[16], pVarsB[16];
    int nMints  = (1 << nVarsB);
    int nMintsB = (1 <<(nVarsB-nVarsS));
    int nMintsS = (1 << nVarsS);
    int s, b, v, m, Mint, MintB, MintS;
    assert( nVars == nVarsB + nVarsF );
    assert( nVars <= 16 );
    assert( nVarsS <= 6 );
    assert( nVarsF >= 1 && nVarsF <= 5 );
    // collect bound/shared variables
    for ( s = b = v = 0; v < nVarsB; v++ )
        if ( (uMaskS >> v) & 1 )
            pVarsB[v] = -1, pVarsS[v] = s++;
        else
            pVarsS[v] = -1, pVarsB[v] = b++;
    assert( s == nVarsS );
    assert( b == nVarsB-nVarsS );
    // clean minterm storage
    for ( s = 0; s < nMintsS; s++ )
        Cof[0][s] = Cof[1][s] = ~(word)0;
    // iterate through bound set minters
    for ( MintS = MintB = Mint = m = 0; m < nMints; m++ )
    {
        // find minterm value
        Value = (p[Mint>>ShiftF] >> ((Mint&MaskF)<<nVarsF)) & MaskFF;
        // check if this cof already appeared 
        if ( !~Cof[0][MintS] || Cof[0][MintS] == Value )
            Cof[0][MintS] = Value;
        else if ( !~Cof[1][MintS] || Cof[1][MintS] == Value )
        {
            Cof[1][MintS] = Value;
            if ( pDec ) 
            {
                int iMintB = MintS * nMintsB + MintB;
                pDec[iMintB>>6] |= (((word)1)<<(iMintB & 63));     
            }
        }
        else
            return 0;            
        // find next minterm
        v = pSched[m];
        Mint ^= (1 << v);
        if ( (uMaskS >> v) & 1 ) // shared variable
            MintS ^= (1 << pVarsS[v]);
        else
            MintB ^= (1 << pVarsB[v]);
    }
    // create composition function
    if ( pComp )
    {
        for ( s = 0; s < nMintsS; s++ )
        {
            pComp[s>>ShiftF] |= (Cof[0][s] << ((s&MaskF) << nVarsF));
            if ( ~Cof[1][s] ) 
                pComp[(s+nMintsS)>>ShiftF] |= (Cof[1][s] << (((s+nMintsS)&MaskF) << nVarsF));
            else
                pComp[(s+nMintsS)>>ShiftF] |= (Cof[0][s] << (((s+nMintsS)&MaskF) << nVarsF));
        }
        if ( nVarsF + nVarsS + 1 < 6 )
            pComp[0] = Abc_Tt6Stretch( pComp[0], nVarsF + nVarsS + 1 );
    }
    if ( pDec && nVarsB < 6 )
        pDec[0] = Abc_Tt6Stretch( pDec[0], nVarsB );
    return 1;
}